

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerCPP::emit_resources(CompilerCPP *this)

{
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *this_00;
  uint *puVar1;
  size_t sVar2;
  bool bVar3;
  uint32_t id_00;
  SPIRConstant *constant;
  SPIRConstantOp *constant_00;
  SPIRType *pSVar4;
  mapped_type *pmVar5;
  SPIRVariable *pSVar6;
  SPIREntryPoint *pSVar7;
  Variant *pVVar8;
  long lVar9;
  ID *pIVar10;
  Variant *id;
  Variant *id_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts;
  string local_50;
  
  pVVar8 = (this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
           ptr;
  for (lVar9 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size * 0x18; lVar9 != 0;
      lVar9 = lVar9 + -0x18) {
    if (pVVar8->type == TypeConstantOp) {
      constant_00 = Variant::get<spirv_cross::SPIRConstantOp>(pVVar8);
      CompilerGLSL::emit_specialization_constant_op(&this->super_CompilerGLSL,constant_00);
    }
    else if (pVVar8->type == TypeConstant) {
      constant = Variant::get<spirv_cross::SPIRConstant>(pVVar8);
      if ((constant->specialization != false) || ((constant->is_used_as_lut & 1U) != 0)) {
        if ((constant->specialization != false) &&
           ((this->super_CompilerGLSL).options.vulkan_semantics == false)) {
          id_00 = Compiler::get_decoration
                            ((Compiler *)this,(ID)(constant->super_IVariant).self.id,
                             DecorationSpecId);
          CompilerGLSL::constant_value_macro_name_abi_cxx11_
                    (&local_50,&this->super_CompilerGLSL,id_00);
          ::std::__cxx11::string::operator=
                    ((string *)&constant->specialization_constant_macro_name,(string *)&local_50);
          ::std::__cxx11::string::~string((string *)&local_50);
        }
        CompilerGLSL::emit_constant(&this->super_CompilerGLSL,constant);
      }
    }
    pVVar8 = pVVar8 + 1;
  }
  pVVar8 = (this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
           ptr;
  this_00 = &(this->super_CompilerGLSL).super_Compiler.ir.meta;
  for (lVar9 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size * 0x18; lVar9 != 0;
      lVar9 = lVar9 + -0x18) {
    if (pVVar8->type == TypeType) {
      pSVar4 = Variant::get<spirv_cross::SPIRType>(pVVar8);
      if (((pSVar4->basetype == Struct) &&
          ((pSVar4->array).super_VectorView<unsigned_int>.buffer_size == 0)) &&
         (pSVar4->pointer == false)) {
        pIVar10 = &(pSVar4->super_IVariant).self;
        pmVar5 = ::std::__detail::
                 _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this_00,pIVar10);
        if (((pmVar5->decoration).decoration_flags.lower & 4) == 0) {
          pmVar5 = ::std::__detail::
                   _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)this_00,pIVar10);
          if (((pmVar5->decoration).decoration_flags.lower & 8) == 0) {
            CompilerGLSL::emit_struct(&this->super_CompilerGLSL,pSVar4);
          }
        }
      }
    }
    pVVar8 = pVVar8 + 1;
  }
  CompilerGLSL::statement<char_const(&)[20],std::__cxx11::string&>
            (&this->super_CompilerGLSL,(char (*) [20])"struct Resources : ",&this->resource_type);
  CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
  pVVar8 = (this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
           ptr;
  lVar9 = (this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
          buffer_size * 0x18;
  do {
    if (lVar9 == 0) {
      pVVar8 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      for (lVar9 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                   super_VectorView<spirv_cross::Variant>.buffer_size * 0x18; lVar9 != 0;
          lVar9 = lVar9 + -0x18) {
        if (pVVar8->type == TypeVariable) {
          pSVar6 = Variant::get<spirv_cross::SPIRVariable>(pVVar8);
          pSVar4 = Compiler::get<spirv_cross::SPIRType>
                             ((Compiler *)this,*(uint32_t *)&(pSVar6->super_IVariant).field_0xc);
          bVar3 = Compiler::is_hidden_variable((Compiler *)this,pSVar6,false);
          if (((!bVar3) && (pSVar6->storage != Function)) &&
             ((pSVar4->pointer == true && (pSVar4->storage == PushConstant)))) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x21])(this,pSVar6);
          }
        }
        pVVar8 = pVVar8 + 1;
      }
      pVVar8 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      for (lVar9 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                   super_VectorView<spirv_cross::Variant>.buffer_size * 0x18; lVar9 != 0;
          lVar9 = lVar9 + -0x18) {
        if (pVVar8->type == TypeVariable) {
          pSVar6 = Variant::get<spirv_cross::SPIRVariable>(pVVar8);
          pSVar4 = Compiler::get<spirv_cross::SPIRType>
                             ((Compiler *)this,*(uint32_t *)&(pSVar6->super_IVariant).field_0xc);
          if (pSVar6->storage != Function) {
            bVar3 = Compiler::is_hidden_variable((Compiler *)this,pSVar6,false);
            if (((!bVar3) && (pSVar4->pointer == true)) &&
               ((pSVar6->storage | StorageClassUniform) == Output)) {
              bVar3 = Compiler::interface_variable_exists_in_entry_point
                                ((Compiler *)this,(pSVar6->super_IVariant).self.id);
              if (bVar3) {
                emit_interface_block(this,pSVar6);
              }
            }
          }
        }
        pVVar8 = pVVar8 + 1;
      }
      pVVar8 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      for (lVar9 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                   super_VectorView<spirv_cross::Variant>.buffer_size * 0x18; lVar9 != 0;
          lVar9 = lVar9 + -0x18) {
        if (pVVar8->type == TypeVariable) {
          pSVar6 = Variant::get<spirv_cross::SPIRVariable>(pVVar8);
          pSVar4 = Compiler::get<spirv_cross::SPIRType>
                             ((Compiler *)this,*(uint32_t *)&(pSVar6->super_IVariant).field_0xc);
          if (pSVar6->storage != Function) {
            bVar3 = Compiler::is_hidden_variable((Compiler *)this,pSVar6,false);
            if (((!bVar3) && (pSVar4->pointer == true)) &&
               ((pSVar4->storage == AtomicCounter ||
                (pSVar4->storage == StorageClassUniformConstant)))) {
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x22])(this,pSVar6);
            }
          }
        }
        pVVar8 = pVVar8 + 1;
      }
      puVar1 = (this->super_CompilerGLSL).super_Compiler.global_variables.
               super_VectorView<unsigned_int>.ptr;
      sVar2 = (this->super_CompilerGLSL).super_Compiler.global_variables.
              super_VectorView<unsigned_int>.buffer_size;
      bVar3 = false;
      for (lVar9 = 0; sVar2 << 2 != lVar9; lVar9 = lVar9 + 4) {
        pSVar6 = Compiler::get<spirv_cross::SPIRVariable>
                           ((Compiler *)this,*(uint32_t *)((long)puVar1 + lVar9));
        if (pSVar6->storage == StorageClassWorkgroup) {
          emit_shared(this,pSVar6);
          bVar3 = true;
        }
      }
      if (bVar3) {
        CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x381f19);
      }
      CompilerGLSL::statement<char_const(&)[40]>
                (&this->super_CompilerGLSL,(char (*) [40])"inline void init(spirv_cross_shader& s)")
      ;
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<std::__cxx11::string&,char_const(&)[11]>
                (&this->super_CompilerGLSL,&this->resource_type,(char (*) [11])"::init(s);");
      ts = (this->resource_registrations).
           super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .ptr;
      for (lVar9 = (this->resource_registrations).
                   super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .buffer_size << 5; lVar9 != 0; lVar9 = lVar9 + -0x20) {
        CompilerGLSL::statement<std::__cxx11::string&>(&this->super_CompilerGLSL,ts);
        ts = ts + 1;
      }
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::clear(&this->resource_registrations);
      CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x381f19);
      CompilerGLSL::statement<char_const(&)[18]>
                (&this->super_CompilerGLSL,(char (*) [18])"Resources* __res;");
      pSVar7 = Compiler::get_entry_point((Compiler *)this);
      if (pSVar7->model == ExecutionModelGLCompute) {
        CompilerGLSL::statement<char_const(&)[36]>
                  (&this->super_CompilerGLSL,(char (*) [36])"ComputePrivateResources __priv_res;");
      }
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x381f19);
      puVar1 = (this->super_CompilerGLSL).super_Compiler.global_variables.
               super_VectorView<unsigned_int>.ptr;
      sVar2 = (this->super_CompilerGLSL).super_Compiler.global_variables.
              super_VectorView<unsigned_int>.buffer_size;
      bVar3 = false;
      for (lVar9 = 0; sVar2 << 2 != lVar9; lVar9 = lVar9 + 4) {
        pSVar6 = Compiler::get<spirv_cross::SPIRVariable>
                           ((Compiler *)this,*(uint32_t *)((long)puVar1 + lVar9));
        if (pSVar6->storage == Private) {
          CompilerGLSL::variable_decl_abi_cxx11_(&local_50,&this->super_CompilerGLSL,pSVar6);
          CompilerGLSL::statement<std::__cxx11::string,char_const(&)[2]>
                    (&this->super_CompilerGLSL,&local_50,(char (*) [2])0x3a919d);
          ::std::__cxx11::string::~string((string *)&local_50);
          bVar3 = true;
        }
      }
      if (bVar3) {
        CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x381f19);
      }
      return;
    }
    if (pVVar8->type == TypeVariable) {
      pSVar6 = Variant::get<spirv_cross::SPIRVariable>(pVVar8);
      pSVar4 = Compiler::get<spirv_cross::SPIRType>
                         ((Compiler *)this,*(uint32_t *)&(pSVar6->super_IVariant).field_0xc);
      if (((pSVar6->storage != Function) && (pSVar4->pointer == true)) &&
         (pSVar4->storage == StorageClassUniform)) {
        bVar3 = Compiler::is_hidden_variable((Compiler *)this,pSVar6,false);
        if (!bVar3) {
          pIVar10 = &(pSVar4->super_IVariant).self;
          pmVar5 = ::std::__detail::
                   _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)this_00,pIVar10);
          if (((pmVar5->decoration).decoration_flags.lower & 4) == 0) {
            pmVar5 = ::std::__detail::
                     _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)this_00,pIVar10);
            if (((pmVar5->decoration).decoration_flags.lower & 8) == 0) goto LAB_002c21c6;
          }
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x20])(this,pSVar6);
        }
      }
    }
LAB_002c21c6:
    pVVar8 = pVVar8 + 1;
    lVar9 = lVar9 + -0x18;
  } while( true );
}

Assistant:

void CompilerCPP::emit_resources()
{
	for (auto &id : ir.ids)
	{
		if (id.get_type() == TypeConstant)
		{
			auto &c = id.get<SPIRConstant>();

			bool needs_declaration = c.specialization || c.is_used_as_lut;

			if (needs_declaration)
			{
				if (!options.vulkan_semantics && c.specialization)
				{
					c.specialization_constant_macro_name =
					    constant_value_macro_name(get_decoration(c.self, DecorationSpecId));
				}
				emit_constant(c);
			}
		}
		else if (id.get_type() == TypeConstantOp)
		{
			emit_specialization_constant_op(id.get<SPIRConstantOp>());
		}
	}

	// Output all basic struct types which are not Block or BufferBlock as these are declared inplace
	// when such variables are instantiated.
	for (auto &id : ir.ids)
	{
		if (id.get_type() == TypeType)
		{
			auto &type = id.get<SPIRType>();
			if (type.basetype == SPIRType::Struct && type.array.empty() && !type.pointer &&
			    (!ir.meta[type.self].decoration.decoration_flags.get(DecorationBlock) &&
			     !ir.meta[type.self].decoration.decoration_flags.get(DecorationBufferBlock)))
			{
				emit_struct(type);
			}
		}
	}

	statement("struct Resources : ", resource_type);
	begin_scope();

	// Output UBOs and SSBOs
	for (auto &id : ir.ids)
	{
		if (id.get_type() == TypeVariable)
		{
			auto &var = id.get<SPIRVariable>();
			auto &type = get<SPIRType>(var.basetype);

			if (var.storage != StorageClassFunction && type.pointer && type.storage == StorageClassUniform &&
			    !is_hidden_variable(var) &&
			    (ir.meta[type.self].decoration.decoration_flags.get(DecorationBlock) ||
			     ir.meta[type.self].decoration.decoration_flags.get(DecorationBufferBlock)))
			{
				emit_buffer_block(var);
			}
		}
	}

	// Output push constant blocks
	for (auto &id : ir.ids)
	{
		if (id.get_type() == TypeVariable)
		{
			auto &var = id.get<SPIRVariable>();
			auto &type = get<SPIRType>(var.basetype);
			if (!is_hidden_variable(var) && var.storage != StorageClassFunction && type.pointer &&
			    type.storage == StorageClassPushConstant)
			{
				emit_push_constant_block(var);
			}
		}
	}

	// Output in/out interfaces.
	for (auto &id : ir.ids)
	{
		if (id.get_type() == TypeVariable)
		{
			auto &var = id.get<SPIRVariable>();
			auto &type = get<SPIRType>(var.basetype);

			if (var.storage != StorageClassFunction && !is_hidden_variable(var) && type.pointer &&
			    (var.storage == StorageClassInput || var.storage == StorageClassOutput) &&
			    interface_variable_exists_in_entry_point(var.self))
			{
				emit_interface_block(var);
			}
		}
	}

	// Output Uniform Constants (values, samplers, images, etc).
	for (auto &id : ir.ids)
	{
		if (id.get_type() == TypeVariable)
		{
			auto &var = id.get<SPIRVariable>();
			auto &type = get<SPIRType>(var.basetype);

			if (var.storage != StorageClassFunction && !is_hidden_variable(var) && type.pointer &&
			    (type.storage == StorageClassUniformConstant || type.storage == StorageClassAtomicCounter))
			{
				emit_uniform(var);
			}
		}
	}

	// Global variables.
	bool emitted = false;
	for (auto global : global_variables)
	{
		auto &var = get<SPIRVariable>(global);
		if (var.storage == StorageClassWorkgroup)
		{
			emit_shared(var);
			emitted = true;
		}
	}

	if (emitted)
		statement("");

	statement("inline void init(spirv_cross_shader& s)");
	begin_scope();
	statement(resource_type, "::init(s);");
	for (auto &reg : resource_registrations)
		statement(reg);
	end_scope();
	resource_registrations.clear();

	end_scope_decl();

	statement("");
	statement("Resources* __res;");
	if (get_entry_point().model == ExecutionModelGLCompute)
		statement("ComputePrivateResources __priv_res;");
	statement("");

	// Emit regular globals which are allocated per invocation.
	emitted = false;
	for (auto global : global_variables)
	{
		auto &var = get<SPIRVariable>(global);
		if (var.storage == StorageClassPrivate)
		{
			if (var.storage == StorageClassWorkgroup)
				emit_shared(var);
			else
				statement(CompilerGLSL::variable_decl(var), ";");
			emitted = true;
		}
	}

	if (emitted)
		statement("");
}